

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O3

RGBColor __thiscall pm::Matte::shade(Matte *this,ShadeRecord *sr)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  long in_RDX;
  long lVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  RGBColor RVar9;
  RGBColor *L;
  Vector3 wi;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a0;
  float local_98;
  undefined8 local_94;
  float local_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  Matte *local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar7 = (sr->ray).o.y;
  uVar4 = *(ulong *)&(sr->normal).z;
  _fStack_80 = 0;
  local_88 = (undefined1  [8])uVar4;
  fVar8 = (sr->ray).o.z;
  local_70 = this;
  (**(code **)(**(long **)(*(long *)(in_RDX + 0x60) + 0x70) + 0x18))(&local_a0);
  local_c8._4_4_ = 0;
  local_c8._0_4_ = fVar8 * (float)uVar4 * local_98;
  local_c8._8_8_ = 0;
  local_b8 = (_func_int **)
             CONCAT44(fVar7 * (float)local_88._0_4_ * (float)((ulong)local_a0 >> 0x20),
                      (float)local_88._0_4_ * (float)local_88._4_4_ * (float)local_a0);
  fStack_b0 = fStack_80 * fStack_80 * 0.0;
  fStack_ac = fStack_7c * fStack_7c * 0.0;
  lVar5 = *(long *)(*(long *)(in_RDX + 0x60) + 0x80) - *(long *)(*(long *)(in_RDX + 0x60) + 0x78);
  fVar7 = (float)local_88._4_4_;
  if (lVar5 != 0) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      plVar1 = *(long **)(*(long *)(*(long *)(in_RDX + 0x60) + 0x78) + uVar4 * 8);
      (**(code **)(*plVar1 + 0x10))(&local_68,plVar1);
      fVar8 = *(float *)(in_RDX + 0x30) * local_60 +
              *(float *)(in_RDX + 0x28) * (float)local_68 +
              (float)((ulong)local_68 >> 0x20) * *(float *)(in_RDX + 0x2c);
      fVar7 = local_60;
      if (0.0 < fVar8) {
        _local_88 = ZEXT416((uint)fVar8);
        if (*(char *)((long)plVar1 + 0xc) == '\x01') {
          local_a0 = *(undefined8 *)(in_RDX + 0x10);
          local_98 = *(float *)(in_RDX + 0x18);
          local_94 = local_68;
          local_8c = local_60;
          cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,&local_a0);
          if (cVar3 != '\0') goto LAB_0010cfce;
        }
        fVar7 = SUB84(sr->world,0);
        fVar8 = (float)((ulong)sr->world >> 0x20);
        local_48 = fVar7 * fVar8 * 0.31830987;
        fStack_44 = *(float *)&sr->tracer * fVar7 * 0.31830987;
        fStack_40 = 0.0;
        fStack_3c = 0.0;
        local_58 = CONCAT44(fVar8,fVar7 * *(float *)((long)&sr->tracer + 4) * 0.31830987);
        uStack_50 = 0;
        (**(code **)(*plVar1 + 0x18))(&local_a0,plVar1);
        fVar7 = (float)local_88._0_4_ * (float)local_a0 * local_48;
        local_b8._4_4_ =
             local_b8._4_4_ + (float)local_88._0_4_ * (float)((ulong)local_a0 >> 0x20) * fStack_44;
        local_b8._0_4_ = (float)local_b8 + fVar7;
        fStack_b0 = fStack_b0 + (float)local_88._0_4_ * fStack_40 * 0.0;
        fStack_ac = fStack_ac + (float)local_88._0_4_ * fStack_3c * 0.0;
        local_c8._0_4_ = (float)local_c8._0_4_ + (float)local_58 * local_98 * (float)local_88._0_4_;
      }
LAB_0010cfce:
      bVar2 = uVar6 < (ulong)(lVar5 >> 3);
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  (local_70->super_Material)._vptr_Material = local_b8;
  (local_70->super_Material).type_ = (Type)local_c8._0_8_;
  RVar9.b = fVar7;
  RVar9.r = (float)local_c8._0_4_;
  RVar9.g = (float)local_c8._4_4_;
  return RVar9;
}

Assistant:

RGBColor Matte::shade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		const Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += diffuseBrdf_.f(sr, wo, wi) * light.L(sr) * nDotWi;
		}
	}

	return L;
}